

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGProblem.h
# Opt level: O2

int __thiscall covenant::CFGProblem::getVar(CFGProblem *this,string *str)

{
  pointer pbVar1;
  pointer pbVar2;
  node_pointer ppVar3;
  int iVar4;
  emplace_return eVar5;
  
  ppVar3 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find_node(&(this->var_table).table_,str);
  if (ppVar3 == (node_pointer)0x0) {
    pbVar1 = (this->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    eVar5 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__cxx11::string,int,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ::try_emplace_unique<std::__cxx11::string_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__cxx11::string,int,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                        *)&this->var_table,str);
    iVar4 = (int)((ulong)((long)pbVar1 - (long)pbVar2) >> 5);
    *(int *)((long)&((eVar5.first.node_.node_)->value_base_).data_.data_ + 0x20) = iVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->names,str);
  }
  else {
    iVar4 = *(int *)((long)&(ppVar3->value_base_).data_.data_ + 0x20);
  }
  return iVar4;
}

Assistant:

int getVar(string& str)
  {
    VarTable::iterator it(var_table.find(str));
    if(it != var_table.end())
    {
      return (*it).second;
    } 
    else 
    {
      int id = names.size();
      var_table[str] = id;
      names.push_back(str);
      return id;
    }
  }